

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O2

void __thiscall QProgressDialogPrivate::ensureSizeIsAtLeastSizeHint(QProgressDialogPrivate *this)

{
  QWidget *this_00;
  QSize QVar1;
  QSize QVar2;
  QSize QVar3;
  long in_FS_OFFSET;
  QSize local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  QVar1 = (QSize)(**(code **)(*(long *)this_00 + 0x70))(this_00);
  local_28 = QVar1;
  if ((this_00->data->widget_attributes & 0x8000) != 0) {
    QVar2 = QWidget::size(this_00);
    QVar3 = QVar2;
    if (QVar2.wd.m_i.m_i < QVar1.wd.m_i.m_i) {
      QVar3 = QVar1;
    }
    if (QVar2.ht.m_i.m_i < QVar1.ht.m_i.m_i) {
      QVar2 = QVar1;
    }
    local_28 = (QSize)((ulong)QVar3 & 0xffffffff | (ulong)QVar2 & 0xffffffff00000000);
  }
  QWidget::resize(this_00,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressDialogPrivate::ensureSizeIsAtLeastSizeHint()
{
    Q_Q(QProgressDialog);

    QSize size = q->sizeHint();
    if (q->isVisible())
        size = size.expandedTo(q->size());
    q->resize(size);
}